

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O3

void __thiscall KVStore::put(KVStore *this,uint64_t key,string *value)

{
  SkipList *this_00;
  pointer pcVar1;
  uint64_t timeStamp;
  uint __val;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  long *plVar6;
  SSTableCache *pSVar7;
  uint uVar8;
  __nlink_t *timeStamp_00;
  ulong uVar9;
  uint uVar10;
  __mode_t __mode;
  pointer ppVar11;
  uint __len;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  SSTableCache *local_170;
  long local_168;
  undefined1 local_160 [48];
  pair<unsigned_long,_int> *local_130;
  _WordT local_128;
  pair<unsigned_long,_int> local_120;
  string *local_110;
  uint64_t local_108;
  string local_100;
  _WordT *local_e0 [2];
  _WordT local_d0 [2];
  undefined1 local_c0 [144];
  
  this_00 = &this->memTable;
  uVar4 = SkipList::getLength(this_00);
  uVar5 = SkipList::getValueSize(this_00);
  if (uVar5 + uVar4 * 0xc + value->_M_string_length + 0x2838 < 0x200000) goto LAB_001044f4;
  pcVar1 = (this->storagePath)._M_dataplus._M_p;
  local_108 = key;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,pcVar1,pcVar1 + (this->storagePath)._M_string_length);
  std::__cxx11::string::append((char *)local_e0);
  iVar3 = stat((char *)local_e0[0],(stat *)local_c0);
  uVar10 = (uint)local_c0._24_4_ >> 0xe;
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  if (((byte)uVar10 & 1 & iVar3 == 0) == 0) {
    pcVar1 = (this->storagePath)._M_dataplus._M_p;
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar1,pcVar1 + (this->storagePath)._M_string_length);
    __mode = 0x10f020;
    std::__cxx11::string::append((char *)local_c0);
    utils::mkdir((char *)local_c0._0_8_,__mode);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
  }
  pcVar1 = (this->storagePath)._M_dataplus._M_p;
  local_130 = &local_120;
  local_110 = value;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + (this->storagePath)._M_string_length);
  std::__cxx11::string::append((char *)&local_130);
  uVar10 = this->fileNums;
  this->fileNums = uVar10 + 1;
  __val = -uVar10;
  if (0 < (int)uVar10) {
    __val = uVar10;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar8 = (uint)uVar9;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_0010428d;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_0010428d;
      }
      if (uVar8 < 10000) goto LAB_0010428d;
      uVar9 = uVar9 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_0010428d:
  local_160._16_8_ = local_160 + 0x20;
  std::__cxx11::string::_M_construct
            ((ulong)(local_160 + 0x10),(char)__len - (char)((int)uVar10 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_160._16_8_ + (ulong)(uVar10 >> 0x1f)),__len,__val);
  ppVar11 = (pointer)0xf;
  if (local_130 != &local_120) {
    ppVar11 = (pointer)local_120.first;
  }
  if (ppVar11 < (pointer)(local_160._24_8_ + local_128)) {
    ppVar11 = (pointer)0xf;
    if ((undefined1 *)local_160._16_8_ != local_160 + 0x20) {
      ppVar11 = (pointer)local_160._32_8_;
    }
    if (ppVar11 < (pointer)(local_160._24_8_ + local_128)) goto LAB_00104304;
    plVar6 = (long *)std::__cxx11::string::replace
                               ((ulong)(local_160 + 0x10),0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00104304:
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_130,local_160._16_8_);
  }
  local_170 = (SSTableCache *)local_160;
  pSVar7 = (SSTableCache *)(plVar6 + 2);
  if ((SSTableCache *)*plVar6 == pSVar7) {
    local_160._0_8_ = (pSVar7->header).timeStamp;
    local_160._8_8_ = plVar6[3];
  }
  else {
    local_160._0_8_ = (pSVar7->header).timeStamp;
    local_170 = (SSTableCache *)*plVar6;
  }
  local_168 = plVar6[1];
  *plVar6 = (long)pSVar7;
  plVar6[1] = 0;
  *(undefined1 *)&(pSVar7->header).timeStamp = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_c0._0_8_ = local_c0 + 0x10;
  timeStamp_00 = (__nlink_t *)(plVar6 + 2);
  if ((__nlink_t *)*plVar6 == timeStamp_00) {
    local_c0._16_8_ = *timeStamp_00;
    local_c0._24_8_ = plVar6[3];
  }
  else {
    local_c0._16_8_ = *timeStamp_00;
    local_c0._0_8_ = (__nlink_t *)*plVar6;
  }
  local_c0._8_8_ = plVar6[1];
  *plVar6 = (long)timeStamp_00;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_170 != (SSTableCache *)local_160) {
    operator_delete(local_170,local_160._0_8_ + 1);
  }
  if ((undefined1 *)local_160._16_8_ != local_160 + 0x20) {
    operator_delete((void *)local_160._16_8_,(ulong)((long)(unsigned_long *)local_160._32_8_ + 1));
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,(ulong)((long)(unsigned_long *)local_120.first + 1));
  }
  SSTable::toSSTable((SSTable *)this_00,(SkipList *)local_c0,(string *)this->timeStamp,
                     (uint64_t)timeStamp_00);
  pSVar7 = (SSTableCache *)operator_new(0x2858);
  timeStamp = this->timeStamp;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_c0._0_8_,
             (_func_result_type_void_ptr *)(local_c0._8_8_ + local_c0._0_8_));
  SSTableCache::SSTableCache(pSVar7,this_00,timeStamp,&local_100);
  local_170 = pSVar7;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
  ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
              *)&this->cache,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
             &local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  this->timeStamp = this->timeStamp + 1;
  SkipList::reset(this_00);
  key = local_108;
  value = local_110;
  compaction(this,0);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
LAB_001044f4:
  SkipList::put(this_00,key,value);
  return;
}

Assistant:

void KVStore::put(uint64_t key, const string &value) {
  // if overflow, convert memTable to a SSTable and do compaction
  if (overflow(memTable.getLength() + 1,
               memTable.getValueSize() + value.size())) {
    if (!utils::dirExists(storagePath + "/level-0"))
      utils::mkdir((storagePath + "/level-0").c_str());

    auto fileName = storagePath + "/level-0/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(memTable, fileName, timeStamp);
    cache.emplace(fileName, new SSTableCache(memTable, timeStamp, fileName));
    timeStamp++;

    memTable.reset();

    compaction(0);
  }
  memTable.put(key, value);
}